

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeCoTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  uint *puVar1;
  Status stat;
  int iVar2;
  pointer pnVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  type_conflict5 tVar8;
  int iVar9;
  SPxOut *pSVar10;
  char *t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *a;
  uint i;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  long local_f8;
  Verbosity local_ec;
  cpp_dec_float<50U,_int,_void> local_e8;
  DIdxSet *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  leavetol(&local_a0,this);
  this->m_pricingViolUpToDate = true;
  this_00 = &this->m_pricingViol;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&this_00->m_backend,0);
  this->m_numViol = 0;
  local_a8 = &this->infeasibilities;
  (this->infeasibilities).super_IdxSet.num = 0;
  local_f8 = (long)(this->thecovectors->set).thenum;
  local_e8.fpclass = cpp_dec_float_finite;
  local_e8.prec_elem = 10;
  local_e8.data._M_elems[0] = 0;
  local_e8.data._M_elems[1] = 0;
  local_e8.data._M_elems[2] = 0;
  local_e8.data._M_elems[3] = 0;
  local_e8.data._M_elems[4] = 0;
  local_e8.data._M_elems[5] = 0;
  local_e8.data._M_elems._24_5_ = 0;
  local_e8.data._M_elems[7]._1_3_ = 0;
  local_e8.data._M_elems._32_5_ = 0;
  local_e8.data._M_elems[9]._1_3_ = 0;
  local_e8.exp = 0;
  local_e8.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
            (&local_e8,&(this->sparsePricingFactor).m_backend,&local_f8);
  iVar9 = boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::convert_to<int>((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_e8);
  i = (this->thecovectors->set).thenum;
  while (0 < (int)i) {
    i = i - 1;
    stat = ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedesc.costat)->data[i];
    if (this->theRep * stat < 1) {
      coTest((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_e8,this,i,stat);
      pnVar3 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar3[i].m_backend.data._M_elems + 8) =
           CONCAT35(local_e8.data._M_elems[9]._1_3_,local_e8.data._M_elems._32_5_);
      puVar1 = pnVar3[i].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_);
      *(undefined8 *)&pnVar3[i].m_backend.data = local_e8.data._M_elems._0_8_;
      *(undefined8 *)(pnVar3[i].m_backend.data._M_elems + 2) = local_e8.data._M_elems._8_8_;
      pnVar3[i].m_backend.exp = local_e8.exp;
      pnVar3[i].m_backend.neg = local_e8.neg;
      pnVar3[i].m_backend.fpclass = local_e8.fpclass;
      pnVar3[i].m_backend.prec_elem = local_e8.prec_elem;
      a = (this->theCoTest).val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start + i;
      local_e8.data._M_elems[9]._1_3_ = local_a0.m_backend.data._M_elems[9]._1_3_;
      local_e8.data._M_elems._32_5_ = local_a0.m_backend.data._M_elems._32_5_;
      local_e8.data._M_elems[7]._1_3_ = local_a0.m_backend.data._M_elems[7]._1_3_;
      local_e8.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
      local_e8.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
      uVar7 = local_e8.data._M_elems[0];
      if (this->remainingRoundsEnter == 0) {
        local_e8.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
        local_e8.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
        local_e8.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
        local_e8.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
        local_e8.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
        local_e8.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
        local_e8.exp = local_a0.m_backend.exp;
        local_e8.neg = local_a0.m_backend.neg;
        local_e8.fpclass = local_a0.m_backend.fpclass;
        local_e8.prec_elem = local_a0.m_backend.prec_elem;
        if (local_a0.m_backend.fpclass != cpp_dec_float_finite || uVar7 != 0) {
          local_e8.neg = (bool)(local_a0.m_backend.neg ^ 1);
        }
        tVar8 = boost::multiprecision::operator<
                          (a,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_e8);
        if (tVar8) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&this_00->m_backend,
                     &(this->theCoTest).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
          DIdxSet::addIdx(local_a8,i);
          (this->isInfeasible).data[i] = 1;
          this->m_numViol = this->m_numViol + 1;
        }
        else {
          (this->isInfeasible).data[i] = 0;
        }
        if (iVar9 < (this->infeasibilities).super_IdxSet.num) {
          pSVar10 = this->spxout;
          if ((pSVar10 != (SPxOut *)0x0) && (3 < (int)pSVar10->m_verbosity)) {
            local_e8.data._M_elems[0] = pSVar10->m_verbosity;
            local_f8 = CONCAT44(local_f8._4_4_,4);
            (*pSVar10->_vptr_SPxOut[2])(pSVar10,&local_f8);
            pSVar10 = soplex::operator<<(this->spxout," --- using dense pricing");
            std::endl<char,std::char_traits<char>>(pSVar10->m_streams[pSVar10->m_verbosity]);
            (*this->spxout->_vptr_SPxOut[2])();
          }
          this->remainingRoundsEnter = 5;
          this->sparsePricingEnter = false;
          (this->infeasibilities).super_IdxSet.num = 0;
        }
      }
      else {
        local_e8.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
        local_e8.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
        local_e8.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
        local_e8.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
        local_e8.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
        local_e8.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
        local_e8.exp = local_a0.m_backend.exp;
        local_e8.neg = local_a0.m_backend.neg;
        local_e8.fpclass = local_a0.m_backend.fpclass;
        local_e8.prec_elem = local_a0.m_backend.prec_elem;
        if (local_a0.m_backend.fpclass != cpp_dec_float_finite || uVar7 != 0) {
          local_e8.neg = (bool)(local_a0.m_backend.neg ^ 1);
        }
        tVar8 = boost::multiprecision::operator<
                          (a,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_e8);
        if (tVar8) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&this_00->m_backend,
                     &(this->theCoTest).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
          this->m_numViol = this->m_numViol + 1;
        }
      }
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&(this->theCoTest).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,0);
      if (this->remainingRoundsEnter == 0) {
        (this->isInfeasible).data[i] = 0;
      }
    }
  }
  iVar2 = (this->infeasibilities).super_IdxSet.num;
  if ((iVar2 == 0) && (this->sparsePricingEnter == false)) {
    this->remainingRoundsEnter = this->remainingRoundsEnter + -1;
  }
  else if ((iVar2 <= iVar9) && (this->sparsePricingEnter == false)) {
    pSVar10 = this->spxout;
    if ((pSVar10 != (SPxOut *)0x0) && (local_ec = pSVar10->m_verbosity, 3 < (int)local_ec)) {
      local_e8.data._M_elems[0] = 4;
      (*pSVar10->_vptr_SPxOut[2])();
      pSVar10 = this->spxout;
      iVar9 = *(int *)(pSVar10->m_streams[pSVar10->m_verbosity] +
                      *(long *)(*(long *)pSVar10->m_streams[pSVar10->m_verbosity] + -0x18) + 8);
      t = " --- using sparse pricing, ";
      if (this->hyperPricingEnter != false) {
        t = " --- using hypersparse pricing, ";
      }
      soplex::operator<<(pSVar10,t);
      pSVar10 = soplex::operator<<(this->spxout,"sparsity: ");
      poVar4 = pSVar10->m_streams[pSVar10->m_verbosity];
      lVar5 = *(long *)poVar4;
      *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 6;
      *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 8) = 4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_e8,(long)(this->infeasibilities).super_IdxSet.num,(type *)0x0);
      local_f8 = (long)(this->thecovectors->set).thenum;
      local_68.fpclass = cpp_dec_float_finite;
      local_68.prec_elem = 10;
      local_68.data._M_elems[0] = 0;
      local_68.data._M_elems[1] = 0;
      local_68.data._M_elems[2] = 0;
      local_68.data._M_elems[3] = 0;
      local_68.data._M_elems[4] = 0;
      local_68.data._M_elems[5] = 0;
      local_68.data._M_elems._24_5_ = 0;
      local_68.data._M_elems[7]._1_3_ = 0;
      local_68.data._M_elems._32_5_ = 0;
      local_68._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                (&local_68,&local_e8,&local_f8);
      pSVar10 = soplex::operator<<(pSVar10,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_68);
      poVar4 = pSVar10->m_streams[pSVar10->m_verbosity];
      lVar5 = *(long *)poVar4;
      lVar6 = *(long *)(lVar5 + -0x18);
      *(uint *)(poVar4 + lVar6 + 0x18) = *(uint *)(poVar4 + lVar6 + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar4 + *(long *)(lVar5 + -0x18) + 8) = (long)iVar9;
      std::endl<char,std::char_traits<char>>(poVar4);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_ec);
    }
    this->sparsePricingEnter = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeCoTest()
{
   int i;
   R pricingTol = leavetol();
   m_pricingViolUpToDate = true;
   m_pricingViol = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());
   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(i = dim() - 1; i >= 0; --i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(i);

      if(isBasic(stat))
      {
         theCoTest[i] = 0;

         if(remainingRoundsEnter == 0)
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         theCoTest[i] = coTest(i, stat);

         if(remainingRoundsEnter == 0)
         {
            if(theCoTest[i] < -pricingTol)
            {
               assert(infeasibilities.size() < infeasibilities.max());
               m_pricingViol -= theCoTest[i];
               infeasibilities.addIdx(i);
               isInfeasible[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilities.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnter = SOPLEX_DENSEROUNDS;
               sparsePricingEnter = false;
               infeasibilities.clear();
            }
         }
         else if(theCoTest[i] < -pricingTol)
         {
            m_pricingViol -= theCoTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingEnter)
      --remainingRoundsEnter;
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingEnter)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilities.size() / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnter = true;
   }
}